

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLIListener.cpp
# Opt level: O2

void __thiscall CLIListener::on_input(CLIListener *this,Poll *p)

{
  pointer pcVar1;
  size_type sVar2;
  int iVar3;
  ssize_t sVar4;
  ostream *poVar5;
  long lVar6;
  ulong uVar7;
  size_type sVar8;
  char ch;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  string arg;
  string line;
  is_any_ofF<char> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  uVar7 = 1;
  while( true ) {
    sVar4 = read((this->super_Subscriber).fd,&ch,1);
    if (((int)sVar4 != 1) || (ch == '\n')) break;
    std::__cxx11::string::push_back((char)&line);
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"Read command ");
  poVar5 = std::operator<<(poVar5,(string *)&line);
  std::endl<char,std::char_traits<char>>(poVar5);
  tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  boost::algorithm::is_any_of<char[2]>(&local_68,(char (*) [2])0x14881a);
  boost::algorithm::
  split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
            (&tokens,&line,&local_68,token_compress_off);
  boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF(&local_68);
  if (tokens.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      tokens.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    print_illegal();
  }
  else {
    arg._M_dataplus._M_p = (pointer)&arg.field_2;
    arg._M_string_length = 0;
    arg.field_2._M_local_buf[0] = '\0';
    if (0x20 < (ulong)((long)tokens.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)tokens.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      lVar6 = 0x20;
      for (; uVar7 < ((long)tokens.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)tokens.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U; uVar7 = uVar7 + 1)
      {
        std::operator+(&local_50,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&((tokens.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar6),' ');
        std::__cxx11::string::append((string *)&arg);
        std::__cxx11::string::~string((string *)&local_50);
        lVar6 = lVar6 + 0x20;
      }
      std::__cxx11::string::append((string *)&arg);
    }
    pcVar1 = ((tokens.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    sVar2 = (tokens.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    for (sVar8 = 0; sVar2 != sVar8; sVar8 = sVar8 + 1) {
      iVar3 = tolower((int)pcVar1[sVar8]);
      pcVar1[sVar8] = (char)iVar3;
    }
    exec_command(this,p,tokens.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,&arg);
    if (((this->super_Subscriber).expected & 1) != 0) {
      print_prompt();
    }
    if ((int)sVar4 == 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Reached EOF, terminating");
      std::endl<char,std::char_traits<char>>(poVar5);
      Poll::do_shutdown(p);
    }
    std::__cxx11::string::~string((string *)&arg);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&tokens);
  std::__cxx11::string::~string((string *)&line);
  return;
}

Assistant:

void CLIListener::on_input(Poll &p) {
  std::string line;
  char ch;
  int read_sz;
  while ((read_sz = read(fd, &ch, 1)) == 1 && ch != '\n') {
    line += ch;
  }
  std::cout << "Read command " << line << std::endl;
  std::vector<std::string> tokens;
  boost::split(tokens, line, boost::is_any_of(" "));
  if (tokens.empty()) {
    print_illegal();
    return;
  }
  std::string arg;
  if (tokens.size() > 1) {
    for (int i = 1; i < tokens.size() - 1; ++i)
      arg += tokens[i] + ' ';
    arg += tokens[tokens.size() - 1];
  }
  std::transform(tokens[0].begin(), tokens[0].end(), tokens[0].begin(), ::tolower);
  exec_command(p, tokens[0], arg);
  if (this->expected & POLLIN) {
    print_prompt();
  }
  if (read_sz == 0) {//EOF reached
    std::cout << "Reached EOF, terminating" << std::endl;
    p.do_shutdown();
  }
}